

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68000_trap(m68k_info *info)

{
  int in_stack_00000008;
  int in_stack_0000000c;
  m68k_info *in_stack_00000010;
  
  build_absolute_jump_with_immediate
            (in_stack_00000010,in_stack_0000000c,in_stack_00000008,info._4_4_);
  return;
}

Assistant:

static void d68000_trap(m68k_info *info)
{
	build_absolute_jump_with_immediate(info, M68K_INS_TRAP, 0, info->ir&0xf);
}